

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint8 *puVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  io::CodedOutputStream::WriteVarint32(output,field_number * 8 + 3);
  iVar2 = (*value->_vptr_MessageLite[0xc])(value);
  if (iVar2 <= output->buffer_size_) {
    puVar1 = output->buffer_;
    output->buffer_ = puVar1 + iVar2;
    output->buffer_size_ = output->buffer_size_ - iVar2;
    if (puVar1 != (uint8 *)0x0) {
      iVar3 = (*value->_vptr_MessageLite[0xb])(value,puVar1);
      if (CONCAT44(extraout_var,iVar3) - (long)puVar1 != (long)iVar2) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/wire_format_lite.cc"
                   ,0x142);
        other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
      }
      goto LAB_0016af5b;
    }
  }
  (*value->_vptr_MessageLite[10])(value,output);
LAB_0016af5b:
  io::CodedOutputStream::WriteVarint32(output,field_number << 3 | 4);
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.SerializeWithCachedSizesToArray(target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}